

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

TupleMake * __thiscall
wasm::Builder::makeTupleMake<ArenaVector<wasm::Expression*>&>
          (Builder *this,ArenaVector<wasm::Expression_*> *operands)

{
  TupleMake *this_00;
  MixedArena *this_01;
  
  this_01 = &this->wasm->allocator;
  this_00 = (TupleMake *)MixedArena::allocSpace(this_01,0x30,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)57>).super_Expression._id = TupleMakeId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)57>).super_Expression.type.id = 0;
  (this_00->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  data = (Expression **)0x0;
  (this_00->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (this_00->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (this_00->operands).allocator = this_01;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<ArenaVector<wasm::Expression*>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&this_00->operands
             ,operands);
  TupleMake::finalize(this_00);
  return this_00;
}

Assistant:

TupleMake* makeTupleMake(ListType&& operands) {
    auto* ret = wasm.allocator.alloc<TupleMake>();
    ret->operands.set(operands);
    ret->finalize();
    return ret;
  }